

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void rhash_sha1_final(sha1_ctx *ctx,uchar *result)

{
  uchar *puVar1;
  uint uVar2;
  uint *msg32;
  uint index;
  uchar *result_local;
  sha1_ctx *ctx_local;
  
  msg32._4_4_ = (uint)ctx->length & 0x3f;
  ctx->message[msg32._4_4_] = 0x80;
  while (msg32._4_4_ = msg32._4_4_ + 1, (msg32._4_4_ & 3) != 0) {
    ctx->message[msg32._4_4_] = '\0';
  }
  msg32._4_4_ = msg32._4_4_ >> 2;
  if (0xe < msg32._4_4_) {
    while (msg32._4_4_ < 0x10) {
      puVar1 = ctx->message + (ulong)msg32._4_4_ * 4;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      msg32._4_4_ = msg32._4_4_ + 1;
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    msg32._4_4_ = 0;
  }
  while (msg32._4_4_ < 0xe) {
    puVar1 = ctx->message + (ulong)msg32._4_4_ * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    msg32._4_4_ = msg32._4_4_ + 1;
  }
  uVar2 = (uint)(ctx->length >> 0x1d);
  *(uint *)(ctx->message + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (uint)(ctx->length << 3);
  *(uint *)(ctx->message + 0x3c) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  rhash_sha1_process_block(ctx->hash,(uint *)ctx);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u32(result,0,ctx->hash,0x14);
  }
  return;
}

Assistant:

void rhash_sha1_final(sha1_ctx *ctx, unsigned char* result)
{
	unsigned  index = (unsigned)ctx->length & 63;
	unsigned* msg32 = (unsigned*)ctx->message;

	/* pad message and run for last block */
	ctx->message[index++] = 0x80;
	while ((index & 3) != 0) {
		ctx->message[index++] = 0;
	}
	index >>= 2;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			msg32[index++] = 0;
		}
		rhash_sha1_process_block(ctx->hash, msg32);
		index = 0;
	}
	while (index < 14) {
		msg32[index++] = 0;
	}
	msg32[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	msg32[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha1_process_block(ctx->hash, msg32);

	if (result) be32_copy(result, 0, &ctx->hash, sha1_hash_size);
}